

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathPopString(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  xmlChar *pxVar1;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlXPathCastToString(val);
    if (pxVar1 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    xmlXPathReleaseObject(ctxt->context,val);
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlXPathPopString (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlChar * ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    ret = xmlXPathCastToString(obj);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}